

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O3

int EmitAlphaYUV(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  int iVar1;
  WebPDecBuffer *pWVar2;
  uint8_t *puVar3;
  long lVar4;
  int iVar5;
  uint8_t *__src;
  uint8_t *__s;
  
  __src = io->a;
  pWVar2 = p->output;
  iVar1 = io->mb_w;
  iVar5 = io->mb_h;
  puVar3 = (pWVar2->u).YUVA.a;
  lVar4 = (long)(pWVar2->u).YUVA.a_stride;
  __s = puVar3 + io->mb_y * lVar4;
  if (__src == (uint8_t *)0x0) {
    if (0 < iVar5 && puVar3 != (uint8_t *)0x0) {
      do {
        memset(__s,0xff,(long)iVar1);
        __s = __s + lVar4;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  else if (0 < iVar5) {
    do {
      memcpy(__s,__src,(long)iVar1);
      __src = __src + io->width;
      __s = __s + (pWVar2->u).YUVA.a_stride;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return 0;
}

Assistant:

static int EmitAlphaYUV(const VP8Io* const io, WebPDecParams* const p,
                        int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  const WebPYUVABuffer* const buf = &p->output->u.YUVA;
  const int mb_w = io->mb_w;
  const int mb_h = io->mb_h;
  uint8_t* dst = buf->a + (ptrdiff_t)io->mb_y * buf->a_stride;
  int j;
  (void)expected_num_lines_out;
  assert(expected_num_lines_out == mb_h);
  if (alpha != NULL) {
    for (j = 0; j < mb_h; ++j) {
      memcpy(dst, alpha, mb_w * sizeof(*dst));
      alpha += io->width;
      dst += buf->a_stride;
    }
  } else if (buf->a != NULL) {
    // the user requested alpha, but there is none, set it to opaque.
    FillAlphaPlane(dst, mb_w, mb_h, buf->a_stride);
  }
  return 0;
}